

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double * dirichlet_variance(int n,double *a)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *pdVar3;
  double dVar4;
  double *variance;
  int i;
  double a_sum;
  double *a_local;
  int n_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)n;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pdVar3 = (double *)operator_new__(uVar2);
  dVar4 = r8vec_sum(n,a);
  for (variance._4_4_ = 0; variance._4_4_ < n; variance._4_4_ = variance._4_4_ + 1) {
    pdVar3[variance._4_4_] =
         (a[variance._4_4_] * (dVar4 - a[variance._4_4_])) / (dVar4 * dVar4 * (dVar4 + 1.0));
  }
  return pdVar3;
}

Assistant:

double *dirichlet_variance ( int n, double a[] )

//****************************************************************************80
//
//  Purpose:
//
//    DIRICHLET_VARIANCE returns the variances of the Dirichlet PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of components.
//
//    Input, double A(N), the probabilities for each component.
//    Each A(I) should be positive.
//
//    Output, double DIRICHLET_VARIANCE(N), the variances of the PDF.
//
{
  double a_sum;
  int i;
  double *variance;

  variance = new double[n];

  a_sum = r8vec_sum ( n, a );

  for ( i = 0; i < n; i++ )
  {
    variance[i] = a[i] * ( a_sum - a[i] ) / ( a_sum * a_sum * ( a_sum + 1.0 ) );
  }

  return variance;
}